

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cc
# Opt level: O1

char __thiscall mcc::Scanner::Next(Scanner *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ErrorReporter *pEVar2;
  _Alloc_hider _Var3;
  undefined8 uVar4;
  char cVar5;
  int iVar6;
  Token *__tmp;
  shared_ptr<mcc::Token> token;
  char local_6c;
  string local_68;
  undefined1 local_48 [16];
  _Base_ptr local_38;
  
  cVar5 = this->putback_;
  if (cVar5 == '\0') {
    iVar6 = fgetc((FILE *)this->source_stream_);
    cVar5 = (char)iVar6;
    if (cVar5 == -1) {
      return -1;
    }
    if (cVar5 == '#') {
      paVar1 = &local_68.field_2;
      do {
        GetToken((Scanner *)local_48);
        uVar4 = local_48._0_8_;
        local_6c = (char)iVar6;
        if (*(int *)((long)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_48._0_8_ + 0xc) != 0x2e) {
          pEVar2 = this->reporter_;
          local_68._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,"Invalid preprocessor output","");
          ErrorReporter::Report(pEVar2,&local_68,local_6c,this->line_,this->c_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != paVar1) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
        }
        iVar6 = *(int *)((long)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)uVar4 + 4);
        GetToken((Scanner *)&local_68);
        uVar4 = local_48._8_8_;
        local_38 = (_Base_ptr)local_68._M_string_length;
        _Var3._M_p = local_68._M_dataplus._M_p;
        local_68._M_dataplus._M_p = (pointer)0x0;
        local_68._M_string_length = 0;
        local_48._0_8_ = _Var3._M_p;
        local_48._8_8_ = local_38;
        if ((_Base_ptr)uVar4 != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
        }
        if ((_Base_ptr)local_68._M_string_length != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length);
        }
        if (*(int *)(_Var3._M_p + 0xc) != 0x2f) {
          pEVar2 = this->reporter_;
          local_68._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,"Invalid preprocessor output","");
          ErrorReporter::Report(pEVar2,&local_68,local_6c,this->line_,this->c_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != paVar1) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
        }
        if (**(char **)(_Var3._M_p + 0x10) != '<') {
          std::__cxx11::string::_M_assign((string *)this->reporter_);
          this->line_ = iVar6;
        }
        do {
          iVar6 = fgetc((FILE *)this->source_stream_);
        } while ((char)iVar6 != '\n');
        iVar6 = fgetc((FILE *)this->source_stream_);
        cVar5 = (char)iVar6;
        if (local_38 != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
        }
      } while (cVar5 == '#');
    }
  }
  else {
    this->putback_ = '\0';
    this->c_ = this->c_ + -1;
  }
  this->c_ = this->c_ + 1;
  if (cVar5 == '\n') {
    this->line_ = this->line_ + 1;
    this->c_ = 0;
  }
  return cVar5;
}

Assistant:

char Scanner::Next() {
  char c;

  if (putback_ != '\0') {
    c = putback_;
    putback_ = '\0';
    c_--;
  } else {
    c = (char) fgetc(source_stream_);
    if (c == EOF) { // eof
      return EOF;
    }

    while (c == '#') { // preprocessor lines
      std::shared_ptr<Token> token = GetToken();
      if (token->GetType() != TokenType::T_INT_LIT)
        reporter_.Report("Invalid preprocessor output", c, line_, c_);

      int line = token->Int();

      token = GetToken();
      if (token->GetType() != TokenType::T_STR_LIT)
        reporter_.Report("Invalid preprocessor output", c, line_, c_);

      if (token->String()[0] != '<') {
        reporter_.SetFile(token->String());
        line_ = line;
      }

      while ((c = (char) fgetc(source_stream_)) != '\n');
      c = (char) fgetc(source_stream_);
    }
  }

  c_++;
  if (c == '\n') {
    line_++;
    c_ = 0;
  }

  return c;
}